

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Clause.cpp
# Opt level: O3

void __thiscall Kernel::Clause::setStore(Clause *this,Store s)

{
  *(ulong *)&this->field_0x38 =
       *(ulong *)&this->field_0x38 & 0xfffffffff1ffffff | (ulong)((s & (SELECTED|NONE)) << 0x19);
  destroyIfUnnecessary(this);
  return;
}

Assistant:

void Clause::setStore(Store s)
{
#if VDEBUG
  //assure there is one selected clause
  static Clause* selected=0;
  if (_store==SELECTED) {
    ASS_EQ(selected, this);
    selected=0;
  }
  if (s==SELECTED) {
    ASS_EQ(selected, 0);
    selected=this;
  }
#endif
#if VAMPIRE_CLAUSE_TRACING
  int traceForward = env.options->traceForward();
  if ((int)number() == traceForward && _store != s) {
    std::cout << number() << ".setStore(" << s << ")" << std::endl;
  }
#endif // VAMPIRE_CLAUSE_TRACING
  _store = s;

  destroyIfUnnecessary();
}